

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

void joypad_truncate_to(JoypadBuffer *buffer,JoypadStateIter iter)

{
  size_t sVar1;
  JoypadButtons local_60;
  JoypadChunk *local_40;
  JoypadChunk *temp;
  JoypadChunk *sentinel;
  JoypadChunk *chunk;
  size_t index;
  JoypadBuffer *buffer_local;
  JoypadStateIter iter_local;
  
  iter_local.chunk = (JoypadChunk *)iter.state;
  buffer_local = (JoypadBuffer *)iter.chunk;
  chunk = (JoypadChunk *)((long)iter_local.chunk - (long)(buffer_local->sentinel).data >> 4);
  (buffer_local->sentinel).size = (size_t)((long)&chunk->data + 1);
  sentinel = (buffer_local->sentinel).next;
  temp = &buffer->sentinel;
  index = (size_t)buffer;
  while (sVar1 = index, sentinel != temp) {
    local_40 = sentinel->next;
    free(sentinel->data);
    free(sentinel);
    sentinel = local_40;
  }
  (buffer_local->sentinel).next = temp;
  temp->prev = &buffer_local->sentinel;
  joypad_unpack_buttons(&local_60,(u8)(iter_local.chunk)->size);
  *(undefined8 *)(sVar1 + 0x28) = local_60._0_8_;
  *(undefined8 *)(sVar1 + 0x30) = local_60._8_8_;
  *(undefined8 *)(sVar1 + 0x38) = local_60._16_8_;
  *(undefined8 *)(sVar1 + 0x40) = local_60._24_8_;
  return;
}

Assistant:

void joypad_truncate_to(JoypadBuffer* buffer, JoypadStateIter iter) {
  size_t index = iter.state - iter.chunk->data;
  iter.chunk->size = index + 1;
  JoypadChunk* chunk = iter.chunk->next;
  JoypadChunk* sentinel = &buffer->sentinel;
  while (chunk != sentinel) {
    JoypadChunk* temp = chunk->next;
    xfree(chunk->data);
    xfree(chunk);
    chunk = temp;
  }
  iter.chunk->next = sentinel;
  sentinel->prev = iter.chunk;
  buffer->last_buttons = joypad_unpack_buttons(iter.state->buttons);
}